

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

PipelineExecuteResult __thiscall duckdb::PipelineExecutor::PushFinalize(PipelineExecutor *this)

{
  Pipeline *pPVar1;
  PhysicalOperator *pPVar2;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var3;
  int iVar4;
  reference this_00;
  pointer pOVar5;
  reference pvVar6;
  InternalException *this_01;
  PipelineExecuteResult PVar7;
  size_type __n;
  OperatorSinkCombineInput combine_input;
  string local_50;
  
  if (this->finalized != true) {
    pPVar1 = this->pipeline;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar1->sink);
    local_50._M_dataplus._M_p =
         (pointer)unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                  ::operator*(&((pPVar1->sink).ptr)->sink_state);
    local_50._M_string_length =
         (size_type)
         unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
         operator*(&this->local_sink_state);
    local_50.field_2._M_allocated_capacity = (size_type)&this->interrupt_state;
    pPVar1 = this->pipeline;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar1->sink);
    pPVar2 = (pPVar1->sink).ptr;
    iVar4 = (*pPVar2->_vptr_PhysicalOperator[0x1b])(pPVar2,&this->context,&local_50);
    PVar7 = INTERRUPTED;
    if ((char)iVar4 != '\x01') {
      this->finalized = true;
      if ((this->intermediate_states).
          super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->intermediate_states).
          super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          this_00 = vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
                    ::operator[](&this->intermediate_states,__n);
          pOVar5 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                   ::operator->(this_00);
          pvVar6 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                             (&this->pipeline->operators,__n);
          (*pOVar5->_vptr_OperatorState[2])(pOVar5,pvVar6->_M_data,&this->context);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->intermediate_states).
                                     super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->intermediate_states).
                                     super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      Executor::Flush(this->pipeline->executor,&this->thread);
      _Var3._M_head_impl =
           (this->local_sink_state).
           super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
           .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
      (this->local_sink_state).
      super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
      super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
      .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
      PVar7 = FINISHED;
      if (_Var3._M_head_impl != (LocalSinkState *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LocalSinkState + 8))();
        PVar7 = FINISHED;
      }
    }
    return PVar7;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Calling PushFinalize on a pipeline that has been finalized already","");
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PipelineExecuteResult PipelineExecutor::PushFinalize() {
	if (finalized) {
		throw InternalException("Calling PushFinalize on a pipeline that has been finalized already");
	}

	D_ASSERT(local_sink_state);

	// Run the combine for the sink
	OperatorSinkCombineInput combine_input {*pipeline.sink->sink_state, *local_sink_state, interrupt_state};

#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (debug_blocked_combine_count < debug_blocked_target_count) {
		debug_blocked_combine_count++;

		auto &callback_state = combine_input.interrupt_state;
		std::thread rewake_thread([callback_state] {
			std::this_thread::sleep_for(std::chrono::milliseconds(1));
			callback_state.Callback();
		});
		rewake_thread.detach();

		return PipelineExecuteResult::INTERRUPTED;
	}
#endif
	auto result = pipeline.sink->Combine(context, combine_input);

	if (result == SinkCombineResultType::BLOCKED) {
		return PipelineExecuteResult::INTERRUPTED;
	}

	finalized = true;
	// flush all query profiler info
	for (idx_t i = 0; i < intermediate_states.size(); i++) {
		intermediate_states[i]->Finalize(pipeline.operators[i].get(), context);
	}
	pipeline.executor.Flush(thread);
	local_sink_state.reset();

	return PipelineExecuteResult::FINISHED;
}